

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void set_twopass_params_based_on_fp_stats(AV1_COMP *cpi,FIRSTPASS_STATS *this_frame_ptr)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  double dVar2;
  FIRSTPASS_STATS *total_stats;
  TWO_PASS_FRAME *twopass_frame;
  
  if (in_RSI != 0) {
    dVar2 = log1p(*(double *)(in_RSI + 0x10));
    in_RDI[0x13ac5] = (long)dVar2;
    iVar1 = is_fp_wavelet_energy_invalid(*(FIRSTPASS_STATS **)(*(long *)(*in_RDI + 0x5d58) + 0x18));
    if (iVar1 == 0) {
      dVar2 = log1p(*(double *)(in_RSI + 0x18));
      in_RDI[0x13ac7] = (long)dVar2;
    }
    if (*(double *)(in_RSI + 0x50) < 0.15) {
      *(undefined1 *)(in_RDI + 0x13ac6) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x13ac6) = 1;
    }
  }
  return;
}

Assistant:

static inline void set_twopass_params_based_on_fp_stats(
    AV1_COMP *cpi, const FIRSTPASS_STATS *this_frame_ptr) {
  if (this_frame_ptr == NULL) return;

  TWO_PASS_FRAME *twopass_frame = &cpi->twopass_frame;
  // The multiplication by 256 reverses a scaling factor of (>> 8)
  // applied when combining MB error values for the frame.
  twopass_frame->mb_av_energy = log1p(this_frame_ptr->intra_error);

  const FIRSTPASS_STATS *const total_stats =
      cpi->ppi->twopass.stats_buf_ctx->total_stats;
  if (is_fp_wavelet_energy_invalid(total_stats) == 0) {
    twopass_frame->frame_avg_haar_energy =
        log1p(this_frame_ptr->frame_avg_wavelet_energy);
  }

  // Set the frame content type flag.
  if (this_frame_ptr->intra_skip_pct >= FC_ANIMATION_THRESH)
    twopass_frame->fr_content_type = FC_GRAPHICS_ANIMATION;
  else
    twopass_frame->fr_content_type = FC_NORMAL;
}